

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O0

void ReadVocab(void)

{
  int iVar1;
  FILE *pFVar2;
  FILE *fin;
  char word [100];
  undefined1 local_19;
  long lStack_18;
  char c;
  longlong i;
  longlong a;
  
  printf("Reading vocabulary...\n");
  lStack_18 = 0;
  pFVar2 = fopen(read_vocab_file,"rb");
  if (pFVar2 == (FILE *)0x0) {
    printf("Vocabulary file not found\n");
    exit(1);
  }
  for (i = 0; i < 30000000; i = i + 1) {
    vocab_hash[i] = -1;
  }
  vocab_size = 0;
  while( true ) {
    ReadWord((char *)&fin,(FILE *)pFVar2);
    iVar1 = feof(pFVar2);
    if (iVar1 != 0) break;
    iVar1 = AddWordToVocab((char *)&fin);
    i = (longlong)iVar1;
    __isoc99_fscanf(pFVar2,"%lld%c",vocab + i,&local_19);
    lStack_18 = lStack_18 + 1;
  }
  SortVocab();
  if (0 < debug_mode) {
    printf("Vocab size: %lld\n",vocab_size);
    printf("Words in train file: %lld\n",train_words);
  }
  if (1 < num_threads) {
    pFVar2 = fopen(train_file,"rb");
    if (pFVar2 == (FILE *)0x0) {
      printf("ERROR: training data file not found!\n");
      exit(1);
    }
    fseek(pFVar2,0,2);
    file_size = ftell(pFVar2);
    fclose(pFVar2);
  }
  return;
}

Assistant:

void ReadVocab() {
  printf("Reading vocabulary...\n");
  long long a, i = 0;
  char c;
  char word[MAX_STRING];
  FILE *fin = fopen(read_vocab_file, "rb");
  if (fin == NULL) {
    printf("Vocabulary file not found\n");
    exit(1);
  }
  for (a = 0; a < vocab_hash_size; a++) vocab_hash[a] = -1;
  vocab_size = 0;
  while (1) {
    ReadWord(word, fin);
    if (feof(fin)) break;
    a = AddWordToVocab(word);
    fscanf(fin, "%lld%c", &vocab[a].cn, &c);
    i++;
  }
  SortVocab();
  if (debug_mode > 0) {
    printf("Vocab size: %lld\n", vocab_size);
    printf("Words in train file: %lld\n", train_words);
  }

  // Don't do this if piping...
  if (num_threads > 1) {
    fin = fopen(train_file, "rb");
    if (fin == NULL) {
      printf("ERROR: training data file not found!\n");
      exit(1);
    }
    fseek(fin, 0, SEEK_END);
    file_size = ftell(fin);
    fclose(fin);
  }
}